

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_add_clienthello_tlsext
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_encoded,bool *out_needs_psk_binder,
               ssl_client_hello_type_t type,size_t header_len)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  pointer psVar4;
  byte *pbVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  ulong local_c0;
  size_t len_before;
  size_t padding_len;
  size_t psk_extension_len;
  size_t bytes_written;
  size_t len_before_1;
  size_t i;
  size_t unpermuted;
  undefined1 local_78 [7];
  bool last_was_empty;
  CBB extensions;
  SSL *ssl;
  size_t header_len_local;
  ssl_client_hello_type_t type_local;
  bool *out_needs_psk_binder_local;
  CBB *out_encoded_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  *out_needs_psk_binder = false;
  if (type == ssl_client_hello_inner) {
    hs_local._7_1_ = ssl_add_clienthello_tlsext_inner(hs,out,out_encoded,out_needs_psk_binder);
  }
  else {
    if (out_encoded != (CBB *)0x0) {
      __assert_fail("out_encoded == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf22,
                    "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                   );
    }
    extensions.u._24_8_ = hs->ssl;
    iVar3 = CBB_add_u16_length_prefixed(out,(CBB *)local_78);
    if (iVar3 == 0) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xf26);
      hs_local._7_1_ = false;
    }
    else {
      (hs->extensions).sent = 0;
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                          (extensions.u._24_8_ + 0x68));
      if ((*(ushort *)&psVar4->field_0x288 >> 5 & 1) != 0) {
        uVar2 = ssl_get_grease_value(hs,ssl_grease_extension1);
        bVar1 = add_padding_extension((CBB *)local_78,uVar2,0);
        if (!bVar1) {
          return false;
        }
      }
      bVar1 = false;
      for (i = 0; i < 0x1c; i = i + 1) {
        bVar1 = Array<unsigned_char>::empty(&hs->extension_permutation);
        if (bVar1) {
          local_c0 = i;
        }
        else {
          pbVar5 = Array<unsigned_char>::operator[](&hs->extension_permutation,i);
          local_c0 = (ulong)*pbVar5;
        }
        sVar6 = CBB_len((CBB *)local_78);
        uVar7 = (**(code **)(kExtensions + local_c0 * 0x28 + 8))(hs,local_78,local_78,type);
        if ((uVar7 & 1) == 0) {
          ERR_put_error(0x10,0,0x93,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0xf3d);
          ERR_add_error_dataf("extension %u",(ulong)*(ushort *)(kExtensions + local_c0 * 0x28));
          return false;
        }
        sVar8 = CBB_len((CBB *)local_78);
        if (sVar8 != sVar6) {
          (hs->extensions).sent = 1 << ((byte)local_c0 & 0x1f) | (hs->extensions).sent;
        }
        bVar1 = sVar8 - sVar6 == 4;
      }
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                          (extensions.u._24_8_ + 0x68));
      if ((*(ushort *)&psVar4->field_0x288 >> 5 & 1) != 0) {
        uVar2 = ssl_get_grease_value(hs,ssl_grease_extension2);
        bVar1 = add_padding_extension((CBB *)local_78,uVar2,1);
        if (!bVar1) {
          return false;
        }
        bVar1 = false;
      }
      sVar6 = ext_pre_shared_key_clienthello_length(hs,type);
      iVar3 = SSL_is_dtls((SSL *)extensions.u._24_8_);
      if (((iVar3 == 0) && (iVar3 = SSL_is_quic((SSL *)extensions.u._24_8_), iVar3 == 0)) &&
         ((*(ushort *)(*(long *)(extensions.u._24_8_ + 0x30) + 0xdc) >> 0xc & 1) == 0)) {
        sVar8 = CBB_len((CBB *)local_78);
        ssl = (SSL *)(sVar8 + 6 + sVar6 + header_len);
        len_before = 0;
        if ((bVar1) && (sVar6 == 0)) {
          len_before = 1;
          ssl = (SSL *)((long)&ssl->method + 5);
        }
        if (((SSL *)0xff < ssl) && (ssl < (SSL *)0x200)) {
          if (len_before != 0) {
            ssl = (SSL *)((long)ssl - (len_before + 4));
          }
          if (-(long)ssl + 0x200U < 5) {
            len_before = 1;
          }
          else {
            len_before = -(long)ssl + 0x1fc;
          }
        }
        if ((len_before != 0) &&
           (bVar1 = add_padding_extension((CBB *)local_78,0x15,len_before), !bVar1)) {
          return false;
        }
      }
      sVar8 = CBB_len((CBB *)local_78);
      bVar1 = ext_pre_shared_key_add_clienthello(hs,(CBB *)local_78,out_needs_psk_binder,type);
      if (bVar1) {
        sVar9 = CBB_len((CBB *)local_78);
        if (sVar6 != sVar9 - sVar8) {
          __assert_fail("psk_extension_len == CBB_len(&extensions) - len_before",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0xf8a,
                        "bool bssl::ssl_add_clienthello_tlsext(SSL_HANDSHAKE *, CBB *, CBB *, bool *, ssl_client_hello_type_t, size_t)"
                       );
        }
        sVar6 = CBB_len((CBB *)local_78);
        if (sVar6 == 0) {
          CBB_discard_child(out);
        }
        iVar3 = CBB_flush(out);
        hs_local._7_1_ = iVar3 != 0;
      }
      else {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xf87);
        hs_local._7_1_ = false;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_add_clienthello_tlsext(SSL_HANDSHAKE *hs, CBB *out, CBB *out_encoded,
                                bool *out_needs_psk_binder,
                                ssl_client_hello_type_t type,
                                size_t header_len) {
  *out_needs_psk_binder = false;

  if (type == ssl_client_hello_inner) {
    return ssl_add_clienthello_tlsext_inner(hs, out, out_encoded,
                                            out_needs_psk_binder);
  }

  assert(out_encoded == nullptr);  // Only ClientHelloInner needs two outputs.
  SSL *const ssl = hs->ssl;
  CBB extensions;
  if (!CBB_add_u16_length_prefixed(out, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // Note we may send multiple ClientHellos for DTLS HelloVerifyRequest and TLS
  // 1.3 HelloRetryRequest. For the latter, the extensions may change, so it is
  // important to reset this value.
  hs->extensions.sent = 0;

  // Add a fake empty extension. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !add_padding_extension(
          &extensions, ssl_get_grease_value(hs, ssl_grease_extension1), 0)) {
    return false;
  }

  bool last_was_empty = false;
  for (size_t unpermuted = 0; unpermuted < kNumExtensions; unpermuted++) {
    size_t i = hs->extension_permutation.empty()
                   ? unpermuted
                   : hs->extension_permutation[unpermuted];
    const size_t len_before = CBB_len(&extensions);
    if (!kExtensions[i].add_clienthello(hs, &extensions, &extensions, type)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_ERROR_ADDING_EXTENSION);
      ERR_add_error_dataf("extension %u", (unsigned)kExtensions[i].value);
      return false;
    }

    const size_t bytes_written = CBB_len(&extensions) - len_before;
    if (bytes_written != 0) {
      hs->extensions.sent |= (1u << i);
    }
    // If the difference in lengths is only four bytes then the extension had
    // an empty body.
    last_was_empty = (bytes_written == 4);
  }

  if (ssl->ctx->grease_enabled) {
    // Add a fake non-empty extension. See RFC 8701.
    if (!add_padding_extension(
            &extensions, ssl_get_grease_value(hs, ssl_grease_extension2), 1)) {
      return false;
    }
    last_was_empty = false;
  }

  // In cleartext ClientHellos, we add the padding extension to work around
  // bugs. We also apply this padding to ClientHelloOuter, to keep the wire
  // images aligned.
  size_t psk_extension_len = ext_pre_shared_key_clienthello_length(hs, type);
  if (!SSL_is_dtls(ssl) && !SSL_is_quic(ssl) &&
      !ssl->s3->used_hello_retry_request) {
    header_len +=
        SSL3_HM_HEADER_LENGTH + 2 + CBB_len(&extensions) + psk_extension_len;
    size_t padding_len = 0;

    // The final extension must be non-empty. WebSphere Application
    // Server 7.0 is intolerant to the last extension being zero-length. See
    // https://crbug.com/363583.
    if (last_was_empty && psk_extension_len == 0) {
      padding_len = 1;
      // The addition of the padding extension may push us into the F5 bug.
      header_len += 4 + padding_len;
    }

    // Add padding to workaround bugs in F5 terminators. See RFC 7685.
    //
    // NB: because this code works out the length of all existing extensions
    // it MUST always appear last (save for any PSK extension).
    if (header_len > 0xff && header_len < 0x200) {
      // If our calculations already included a padding extension, remove that
      // factor because we're about to change its length.
      if (padding_len != 0) {
        header_len -= 4 + padding_len;
      }
      padding_len = 0x200 - header_len;
      // Extensions take at least four bytes to encode. Always include at least
      // one byte of data if including the extension. WebSphere Application
      // Server 7.0 is intolerant to the last extension being zero-length. See
      // https://crbug.com/363583.
      if (padding_len >= 4 + 1) {
        padding_len -= 4;
      } else {
        padding_len = 1;
      }
    }

    if (padding_len != 0 &&
        !add_padding_extension(&extensions, TLSEXT_TYPE_padding, padding_len)) {
      return false;
    }
  }

  // The PSK extension must be last, including after the padding.
  const size_t len_before = CBB_len(&extensions);
  if (!ext_pre_shared_key_add_clienthello(hs, &extensions, out_needs_psk_binder,
                                          type)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  assert(psk_extension_len == CBB_len(&extensions) - len_before);
  (void)len_before;  // |assert| is omitted in release builds.

  // Discard empty extensions blocks.
  if (CBB_len(&extensions) == 0) {
    CBB_discard_child(out);
  }

  return CBB_flush(out);
}